

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

bool __thiscall gui::MultilineTextBox::handleKeyPressed(MultilineTextBox *this,KeyEvent *key)

{
  pointer puVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  Uint32 UVar5;
  size_t sVar6;
  pointer puVar7;
  size_t sVar8;
  Iterator funcArgs;
  reference puVar9;
  size_type sVar10;
  KeyEvent *in_RSI;
  Widget *in_RDI;
  uint c;
  Iterator __end10;
  Iterator __begin10;
  String *__range10;
  bool textChanged;
  size_t i_1;
  String *line_1;
  bool foundSpace;
  size_t i;
  String *line;
  bool foundNonSpace;
  anon_class_8_1_8991fb9c getSelectedText;
  size_t caretOffset;
  bool eventConsumed;
  undefined1 in_stack_00000243;
  uint32_t in_stack_00000244;
  MultilineTextBox *in_stack_00000248;
  String *in_stack_fffffffffffffdf8;
  String *in_stack_fffffffffffffe00;
  size_type sVar11;
  Vector2<unsigned_long> *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe16;
  byte bVar12;
  undefined1 in_stack_fffffffffffffe17;
  size_t in_stack_fffffffffffffe18;
  MultilineTextBox *in_stack_fffffffffffffe20;
  vector<sf::String,_std::allocator<sf::String>_> *stringArray;
  Signal<gui::Widget_*,_unsigned_long> *in_stack_fffffffffffffe30;
  Vector2<unsigned_long> *in_stack_fffffffffffffe38;
  MultilineTextBox *in_stack_fffffffffffffe40;
  pointer local_1a8;
  int in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  MultilineTextBox *in_stack_fffffffffffffe70;
  Vector2<unsigned_long> local_158;
  Vector2<unsigned_long> local_148;
  Vector2<unsigned_long> local_138;
  Vector2<unsigned_long> local_128;
  uint local_114;
  uint *local_110;
  __normal_iterator<unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_108;
  vector<sf::String,_std::allocator<sf::String>_> local_100;
  vector<sf::String,_std::allocator<sf::String>_> *local_e0;
  byte local_d1;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff58;
  Vector2<unsigned_long> local_80;
  pointer local_70;
  reference local_68;
  byte local_59;
  undefined1 in_stack_ffffffffffffffb7;
  Vector2<unsigned_long> *in_stack_ffffffffffffffb8;
  MultilineTextBox *in_stack_ffffffffffffffc0;
  
  bVar3 = Widget::handleKeyPressed(in_RDI,in_RSI);
  sVar6 = findCaretOffset(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if ((in_RSI->control & 1U) == 0) {
    if (in_RSI->code == Enter) {
      lVar2._0_4_ = in_RDI[1].transformable_.m_rotation;
      lVar2._4_4_ = in_RDI[1].transformable_.m_scale.x;
      if (lVar2 == 1) {
        return bVar3;
      }
      bVar4 = insertCharacter(in_stack_00000248,in_stack_00000244,(bool)in_stack_00000243);
      if (!bVar4) {
        return bVar3;
      }
    }
    else if (in_RSI->code == BackSpace) {
      insertCharacter(in_stack_00000248,in_stack_00000244,(bool)in_stack_00000243);
    }
    else if (in_RSI->code == Tab) {
      if (in_RDI[1].transformable_.m_transform.m_matrix[0] == 1.4013e-45) {
        return bVar3;
      }
      insertCharacter(in_stack_00000248,in_stack_00000244,(bool)in_stack_00000243);
    }
    else if (in_RSI->code == Delete) {
      insertCharacter(in_stack_00000248,in_stack_00000244,(bool)in_stack_00000243);
    }
    else if (in_RSI->code == PageUp) {
      updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          (bool)in_stack_fffffffffffffe17);
    }
    else if (in_RSI->code == PageDown) {
      anon_unknown.dwarf_32e87c::findStringsLength
                ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffe20);
      updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          (bool)in_stack_fffffffffffffe17);
    }
    else if (in_RSI->code == Home) {
      sf::Vector2<unsigned_long>::Vector2(&local_128,0,in_RDI[1].name_.m_string._M_string_length);
      updateCaretPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (bool)in_stack_ffffffffffffffb7);
    }
    else if (in_RSI->code == End) {
      std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                ((vector<sf::String,_std::allocator<sf::String>_> *)
                 (in_RDI[1].transformable_.m_transform.m_matrix + 0xb),
                 in_RDI[1].name_.m_string._M_string_length);
      sVar6 = sf::String::getSize((String *)0x25dd4e);
      sf::Vector2<unsigned_long>::Vector2
                (&local_138,sVar6,in_RDI[1].name_.m_string._M_string_length);
      updateCaretPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (bool)in_stack_ffffffffffffffb7);
    }
    else if (in_RSI->code == Up) {
      if (in_RDI[1].name_.m_string._M_string_length == 0) {
        updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            (bool)in_stack_fffffffffffffe17);
      }
      else {
        sf::Vector2<unsigned_long>::Vector2
                  (&local_148,(unsigned_long)in_RDI[1].name_.m_string._M_dataplus._M_p,
                   in_RDI[1].name_.m_string._M_string_length - 1);
        findCaretOffset(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            (bool)in_stack_fffffffffffffe17);
      }
    }
    else if (in_RSI->code == Down) {
      sVar11 = in_RDI[1].name_.m_string._M_string_length;
      sVar10 = std::vector<sf::String,_std::allocator<sf::String>_>::size
                         ((vector<sf::String,_std::allocator<sf::String>_> *)
                          (in_RDI[1].transformable_.m_transform.m_matrix + 0xb));
      if (sVar11 < sVar10 - 1) {
        sf::Vector2<unsigned_long>::Vector2
                  (&local_158,(unsigned_long)in_RDI[1].name_.m_string._M_dataplus._M_p,
                   in_RDI[1].name_.m_string._M_string_length + 1);
        findCaretOffset(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            (bool)in_stack_fffffffffffffe17);
      }
      else {
        anon_unknown.dwarf_32e87c::findStringsLength
                  ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffe20);
        updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            (bool)in_stack_fffffffffffffe17);
      }
    }
    else if (in_RSI->code == Left) {
      if ((((ulong)in_RDI[2].super_enable_shared_from_this<gui::Widget>._M_weak_this.
                   super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1) == 0) ||
         ((in_RSI->shift & 1U) != 0)) {
        if (sVar6 != 0) {
          updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (bool)in_stack_fffffffffffffe17);
        }
      }
      else {
        anon_unknown.dwarf_32e87c::sortByYFirst<unsigned_long>
                  ((Vector2<unsigned_long> *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
                   in_stack_fffffffffffffe08);
        updateCaretPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                            (bool)in_stack_ffffffffffffffb7);
      }
    }
    else {
      if (in_RSI->code != Right) {
        return bVar3;
      }
      if ((((ulong)in_RDI[2].super_enable_shared_from_this<gui::Widget>._M_weak_this.
                   super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1) == 0) ||
         ((in_RSI->shift & 1U) != 0)) {
        sVar8 = anon_unknown.dwarf_32e87c::findStringsLength
                          ((vector<sf::String,_std::allocator<sf::String>_> *)
                           in_stack_fffffffffffffe20);
        if (sVar6 < sVar8) {
          updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (bool)in_stack_fffffffffffffe17);
        }
      }
      else {
        anon_unknown.dwarf_32e87c::sortByYFirst<unsigned_long>
                  ((Vector2<unsigned_long> *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,in_stack_fffffffffffffe10)),
                   in_stack_fffffffffffffe08);
        updateCaretPosition(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                            (bool)in_stack_ffffffffffffffb7);
      }
    }
  }
  else {
    bVar4 = SUB81((ulong)in_RDI >> 0x38,0);
    if (in_RSI->code == Up) {
      updateScroll(in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f,
                   in_stack_fffffffffffffe68,bVar4);
    }
    else if (in_RSI->code == Down) {
      updateScroll(in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f,
                   in_stack_fffffffffffffe68,bVar4);
    }
    else if (in_RSI->code == Left) {
      if (in_RDI[1].name_.m_string._M_dataplus._M_p == (pointer)0x0) {
        if (sVar6 != 0) {
          updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (bool)in_stack_fffffffffffffe17);
        }
      }
      else {
        bVar3 = false;
        std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                  ((vector<sf::String,_std::allocator<sf::String>_> *)
                   (in_RDI[1].transformable_.m_transform.m_matrix + 0xb),
                   in_RDI[1].name_.m_string._M_string_length);
        local_1a8 = in_RDI[1].name_.m_string._M_dataplus._M_p;
        do {
          while( true ) {
            local_1a8 = (pointer)((long)local_1a8 + -1);
            if (local_1a8 == (pointer)0x0) goto LAB_0025d61e;
            UVar5 = sf::String::operator[]
                              (in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
            if (UVar5 == 0x20) break;
            bVar3 = true;
          }
        } while (!bVar3);
LAB_0025d61e:
        UVar5 = sf::String::operator[](in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
        if ((UVar5 == 0x20) && (bVar3)) {
          local_1a8 = (pointer)((long)local_1a8 + 1);
        }
        sf::Vector2<unsigned_long>::Vector2
                  ((Vector2<unsigned_long> *)&stack0xffffffffffffffa8,(unsigned_long)local_1a8,
                   in_RDI[1].name_.m_string._M_string_length);
        findCaretOffset(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            (bool)in_stack_fffffffffffffe17);
      }
    }
    else if (in_RSI->code == Right) {
      puVar1 = in_RDI[1].name_.m_string._M_dataplus._M_p;
      std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                ((vector<sf::String,_std::allocator<sf::String>_> *)
                 (in_RDI[1].transformable_.m_transform.m_matrix + 0xb),
                 in_RDI[1].name_.m_string._M_string_length);
      puVar7 = (pointer)sf::String::getSize((String *)0x25d729);
      if (puVar1 < puVar7) {
        local_59 = 0;
        local_68 = std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                             ((vector<sf::String,_std::allocator<sf::String>_> *)
                              (in_RDI[1].transformable_.m_transform.m_matrix + 0xb),
                              in_RDI[1].name_.m_string._M_string_length);
        for (local_70 = in_RDI[1].name_.m_string._M_dataplus._M_p; puVar1 = local_70,
            puVar7 = (pointer)sf::String::getSize((String *)0x25d796), puVar1 < puVar7;
            local_70 = (pointer)((long)local_70 + 1)) {
          UVar5 = sf::String::operator[]
                            (in_stack_fffffffffffffe00,(size_t)in_stack_fffffffffffffdf8);
          if (UVar5 == 0x20) {
            local_59 = 1;
          }
          else if ((local_59 & 1) != 0) break;
        }
        sf::Vector2<unsigned_long>::Vector2
                  (&local_80,(unsigned_long)local_70,in_RDI[1].name_.m_string._M_string_length);
        findCaretOffset(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                            (bool)in_stack_fffffffffffffe17);
      }
      else {
        sVar8 = anon_unknown.dwarf_32e87c::findStringsLength
                          ((vector<sf::String,_std::allocator<sf::String>_> *)
                           in_stack_fffffffffffffe20);
        if (sVar6 < sVar8) {
          updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (bool)in_stack_fffffffffffffe17);
        }
      }
    }
    else if (in_RSI->code == A) {
      updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          (bool)in_stack_fffffffffffffe17);
      anon_unknown.dwarf_32e87c::findStringsLength
                ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffe20);
      updateCaretPosition(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          (bool)in_stack_fffffffffffffe17);
    }
    else if (in_RSI->code == X) {
      if (((ulong)in_RDI[2].super_enable_shared_from_this<gui::Widget>._M_weak_this.
                  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1) != 0) {
        handleKeyPressed::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff58);
        sf::Clipboard::setString((String *)0x25d919);
        sf::String::~String((String *)0x25d928);
        insertCharacter(in_stack_00000248,in_stack_00000244,(bool)in_stack_00000243);
      }
    }
    else if (in_RSI->code == C) {
      if (((ulong)in_RDI[2].super_enable_shared_from_this<gui::Widget>._M_weak_this.
                  super___weak_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 1) != 0) {
        handleKeyPressed::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff58);
        sf::Clipboard::setString((String *)0x25d9a5);
        sf::String::~String((String *)0x25d9b4);
      }
    }
    else {
      if (in_RSI->code != V) {
        return bVar3;
      }
      local_d1 = 0;
      stringArray = &local_100;
      sf::Clipboard::getString();
      local_e0 = stringArray;
      funcArgs = sf::String::begin_abi_cxx11_(in_stack_fffffffffffffdf8);
      local_108._M_current = funcArgs._M_current;
      local_110 = (uint *)sf::String::end_abi_cxx11_(in_stack_fffffffffffffdf8);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_fffffffffffffe00,
                                (__normal_iterator<unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_fffffffffffffdf8), bVar3) {
        puVar9 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_108);
        local_114 = *puVar9;
        bVar3 = insertCharacter(in_stack_00000248,in_stack_00000244,(bool)in_stack_00000243);
        bVar12 = 1;
        if (!bVar3) {
          bVar12 = local_d1;
        }
        local_d1 = bVar12 & 1;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_108);
      }
      sf::String::~String((String *)0x25da81);
      if ((local_d1 & 1) != 0) {
        anon_unknown.dwarf_32e87c::findStringsLength(stringArray);
        Signal<gui::Widget_*,_unsigned_long>::emit
                  (in_stack_fffffffffffffe30,(Widget *)funcArgs._M_current,
                   (unsigned_long)stringArray);
      }
    }
  }
  return true;
}

Assistant:

bool MultilineTextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    size_t caretOffset = findCaretOffset(caretPosition_);

    auto getSelectedText = [this]() -> sf::String {
        sf::String selectedText = "";
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    selectedText += boxStrings_[y].substring(selection.first.x, selection.second.x - selection.first.x);
                } else {
                    selectedText += boxStrings_[y].substring(selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                selectedText += "\n" + boxStrings_[y];
            } else if (y == selection.second.y) {
                selectedText += "\n" + boxStrings_[y].substring(0, selection.second.x);
            }
        }
        GUI_DEBUG << "selectedText = [" << selectedText.toAnsiString() << "]\n";
        return selectedText;
    };

    if (key.control) {
        if (key.code == sf::Keyboard::Up) {
            updateScroll(true, 1, key.shift);
        } else if (key.code == sf::Keyboard::Down) {
            updateScroll(true, -1, key.shift);
        } else if (key.code == sf::Keyboard::Left) {
            if (caretPosition_.x > 0) {
                bool foundNonSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x - 1;
                while (i > 0) {
                    if (line[i] != ' ') {
                        foundNonSpace = true;
                    } else if (foundNonSpace) {
                        break;
                    }
                    --i;
                }
                updateCaretPosition(findCaretOffset({(line[i] == ' ' && foundNonSpace ? i + 1 : i), caretPosition_.y}), key.shift);
            } else if (caretOffset > 0) {
                updateCaretPosition(caretOffset - 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::Right) {
            if (caretPosition_.x < boxStrings_[caretPosition_.y].getSize()) {
                bool foundSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x;
                while (i < line.getSize()) {
                    if (line[i] == ' ') {
                        foundSpace = true;
                    } else if (foundSpace) {
                        break;
                    }
                    ++i;
                }
                updateCaretPosition(findCaretOffset({i, caretPosition_.y}), key.shift);
            } else if (caretOffset < findStringsLength(boxStrings_)) {
                updateCaretPosition(caretOffset + 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::A) {
            updateCaretPosition(0, false);
            updateCaretPosition(findStringsLength(boxStrings_), true);
        } else if (key.code == sf::Keyboard::X) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
                insertCharacter('\u0008');
            }
        } else if (key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
            }
        } else if (key.code == sf::Keyboard::V) {
            bool textChanged = false;
            for (auto c : sf::Clipboard::getString()) {
                textChanged = insertCharacter(c, true) || textChanged;
            }
            if (textChanged) {
                onTextChange.emit(this, findStringsLength(boxStrings_));
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::Enter) {
        if (maxLines_ == 1 || !insertCharacter('\u000a')) {
            return eventConsumed;
        }
    } else if (key.code == sf::Keyboard::Backspace) {
        insertCharacter('\u0008');
    } else if (key.code == sf::Keyboard::Tab) {
        if (tabPolicy_ == TabPolicy::ignoreTab) {
            return eventConsumed;
        }
        insertCharacter('\u0009');
    } else if (key.code == sf::Keyboard::Delete) {
        insertCharacter('\u007f');
    } else if (key.code == sf::Keyboard::PageUp) {
        updateCaretPosition(0, key.shift);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateCaretPosition(findStringsLength(boxStrings_), key.shift);
    } else if (key.code == sf::Keyboard::Home) {
        updateCaretPosition({0, caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::End) {
        updateCaretPosition({boxStrings_[caretPosition_.y].getSize(), caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::Up) {
        if (caretPosition_.y > 0) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y - 1}), key.shift);
        } else {
            updateCaretPosition(0, key.shift);
        }
    } else if (key.code == sf::Keyboard::Down) {
        if (caretPosition_.y < boxStrings_.size() - 1) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y + 1}), key.shift);
        } else {
            updateCaretPosition(findStringsLength(boxStrings_), key.shift);
        }
    } else if (key.code == sf::Keyboard::Left) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).first, false);
        } else if (caretOffset > 0) {
            updateCaretPosition(caretOffset - 1, key.shift);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).second, false);
        } else if (caretOffset < findStringsLength(boxStrings_)) {
            updateCaretPosition(caretOffset + 1, key.shift);
        }
    } else {
        return eventConsumed;
    }
    return true;
}